

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

IRet * __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::CompMatFuncBase<2,_3>::doApply
          (IRet *__return_storage_ptr__,CompMatFuncBase<2,_3> *this,EvalContext *ctx,IArgs *iargs)

{
  bool *pbVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  undefined1 local_7a;
  undefined1 local_79;
  long local_78;
  long local_70;
  bool *local_68;
  bool *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined8 local_48;
  double dStack_40;
  undefined8 local_38;
  
  tcu::Matrix<tcu::Interval,_2,_3>::Matrix(__return_storage_ptr__);
  lVar3 = 0;
  local_78 = 0;
  do {
    lVar4 = 1;
    local_70 = lVar3;
    do {
      plVar2 = (long *)(**(code **)(*(long *)this + 0x58))(this);
      local_68 = &(iargs->a->m_data).m_data[0].m_data[0].m_hasNaN + lVar3;
      local_60 = &(iargs->b->m_data).m_data[0].m_data[0].m_hasNaN + lVar3;
      local_58 = &local_79;
      local_50 = &local_7a;
      (**(code **)(*plVar2 + 0x40))(&local_48,plVar2,ctx,&local_68);
      *(undefined8 *)((long)&(__return_storage_ptr__->m_data).m_data[0].m_data[0].m_hi + lVar3) =
           local_38;
      pbVar1 = &(__return_storage_ptr__->m_data).m_data[0].m_data[0].m_hasNaN + lVar3;
      *(undefined8 *)pbVar1 = local_48;
      *(double *)(pbVar1 + 8) = dStack_40;
      lVar3 = lVar3 + 0x18;
      lVar4 = lVar4 + -1;
    } while (lVar4 == 0);
    local_78 = local_78 + 1;
    lVar3 = local_70 + 0x30;
  } while (local_78 != 3);
  return __return_storage_ptr__;
}

Assistant:

IRet	doApply	(const EvalContext& ctx, const IArgs& iargs) const
	{
		IRet			ret;

		for (int col = 0; col < Cols; ++col)
		{
			for (int row = 0; row < Rows; ++row)
				ret[col][row] = this->doGetScalarFunc().apply(ctx,
															  iargs.a[col][row],
															  iargs.b[col][row]);
		}

		return ret;
	}